

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolHashArray.c
# Opt level: O3

int * deTestHashArrayHash_find(deTestHashArrayHash *hash,deInt16 key)

{
  uint uVar1;
  int *piVar2;
  deTestHashArrayHashSlot *pdVar3;
  long lVar4;
  
  if (0 < hash->numElements) {
    uVar1 = ((uint)(int)key >> 0x10 ^ (int)key ^ 0x3d) * 9;
    uVar1 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
    for (pdVar3 = hash->slotTable[(int)(hash->slotTableSize - 1U & (uVar1 >> 0xf ^ uVar1))];
        pdVar3 != (deTestHashArrayHashSlot *)0x0; pdVar3 = pdVar3->nextSlot) {
      if (0 < (long)pdVar3->numUsed) {
        piVar2 = pdVar3->values;
        lVar4 = 0;
        do {
          if (pdVar3->keys[lVar4] == key) {
            return piVar2;
          }
          lVar4 = lVar4 + 1;
          piVar2 = piVar2 + 1;
        } while (pdVar3->numUsed != lVar4);
      }
    }
  }
  return (int *)0x0;
}

Assistant:

void dePoolHashArray_selfTest (void)
{
	deMemPool*			pool		= deMemPool_createRoot(DE_NULL, 0);
	deTestHashArray*	hashArray	= deTestHashArray_create(pool);
	deInt16Array*		keyArray	= deInt16Array_create(pool);
	deIntArray*			valueArray	= deIntArray_create(pool);
	int					iter;

	for (iter = 0; iter < 3; iter++)
	{
		int i;

		/* Insert a bunch of values. */
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);
		for (i = 0; i < 20; i++)
		{
			deTestHashArray_insert(hashArray, (deInt16)(-i^0x5), 2*i+5);
		}
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 20);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);
		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 20);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 20);

		for (i = 0; i < 20; i++)
		{
			DE_TEST_ASSERT(deInt16Array_get(keyArray, i) == (deInt16)(-i^0x5));
			DE_TEST_ASSERT(deIntArray_get(valueArray, i) == 2*i+5);
		}

		deTestHashArray_reset(hashArray);
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);

		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 0);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 0);
	}

	deMemPool_destroy(pool);
}